

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O0

_ElementType * __thiscall
Lib::
CatIterator<Lib::VirtualIterator<Inferences::InductionContext>,_Lib::IterTraits<Lib::SingletonIterator<Inferences::InductionContext>_>_>
::next(CatIterator<Lib::VirtualIterator<Inferences::InductionContext>,_Lib::IterTraits<Lib::SingletonIterator<Inferences::InductionContext>_>_>
       *this)

{
  byte *in_RSI;
  CatIterator<Lib::VirtualIterator<Inferences::InductionContext>,_Lib::IterTraits<Lib::SingletonIterator<Inferences::InductionContext>_>_>
  *in_RDI;
  IterTraits<Lib::SingletonIterator<Inferences::InductionContext>_> *in_stack_00000038;
  CatIterator<Lib::VirtualIterator<Inferences::InductionContext>,_Lib::IterTraits<Lib::SingletonIterator<Inferences::InductionContext>_>_>
  *this_00;
  
  this_00 = in_RDI;
  hasNext(in_RDI);
  if ((*in_RSI & 1) == 0) {
    IterTraits<Lib::SingletonIterator<Inferences::InductionContext>_>::next(in_stack_00000038);
  }
  else {
    VirtualIterator<Inferences::InductionContext>::next
              ((VirtualIterator<Inferences::InductionContext> *)this_00);
  }
  return (_ElementType *)in_RDI;
}

Assistant:

OWN_ELEMENT_TYPE next()
  {
    ALWAYS(hasNext())
    if(_first) {
      //_it1 contains the next value, as hasNext must have
      //been called before. (It would have updated the
      //_first value otherwise.)
      return _it1.next();
    }
    return  _it2.next();
  }